

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestAbort::Run(TestAbort *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  Results rs;
  TestAbortInternal myTestB;
  TestAbortInternal myTestA;
  ostringstream oss;
  TestRegistry r;
  string local_16c0;
  Results local_16a0;
  TestAbortInternal local_1688;
  RunParams local_1640;
  TestAbortInternal local_1628;
  ostringstream local_15e0 [376];
  TestRegistry local_1468;
  
  testinator::TestRegistry::TestRegistry(&local_1468);
  std::__cxx11::ostringstream::ostringstream(local_15e0);
  local_1688.super_Test._vptr_Test._0_4_ = 0;
  std::
  make_unique<testinator::DefaultOutputter,std::__cxx11::ostringstream&,testinator::OutputFlags>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1628
             ,(OutputFlags *)local_15e0);
  std::__cxx11::string::string((string *)&local_1688,"A",(allocator *)&local_16c0);
  TestAbortInternal::TestAbortInternal(&local_1628,&local_1468,(string *)&local_1688);
  std::__cxx11::string::~string((string *)&local_1688);
  std::__cxx11::string::string((string *)&local_16c0,"B",(allocator *)&local_1640);
  TestAbortInternal::TestAbortInternal(&local_1688,&local_1468,&local_16c0);
  std::__cxx11::string::~string((string *)&local_16c0);
  local_1640.m_numPropertyChecks = 100;
  local_1640.m_randomSeed = 0;
  local_1640.m_flags = 1;
  testinator::TestRegistry::RunAllTests
            (&local_16a0,&local_1468,&local_1640,(Outputter *)local_1628.super_Test._vptr_Test);
  if (Run()::expected_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&Run()::expected_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string
                ((string *)&Run()::expected_abi_cxx11_,"ABORT (Hello world 42)",
                 (allocator *)&local_16c0);
      __cxa_atexit(std::__cxx11::string::~string,&Run()::expected_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&Run()::expected_abi_cxx11_);
    }
  }
  if (local_1688.m_runCalled == false) {
    std::__cxx11::stringbuf::str();
    lVar2 = std::__cxx11::string::find((string *)&local_16c0,0x17ba80);
    bVar3 = lVar2 != -1;
    std::__cxx11::string::~string((string *)&local_16c0);
  }
  else {
    bVar3 = false;
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector(&local_16a0);
  testinator::Test::~Test(&local_1688.super_Test);
  testinator::Test::~Test(&local_1628.super_Test);
  if ((Outputter *)local_1628.super_Test._vptr_Test != (Outputter *)0x0) {
    (*(*(_func_int ***)local_1628.super_Test._vptr_Test)[8])(local_1628.super_Test._vptr_Test);
  }
  std::__cxx11::ostringstream::~ostringstream(local_15e0);
  testinator::TestRegistry::~TestRegistry(&local_1468);
  return bVar3;
}

Assistant:

virtual bool Run()
  {
    testinator::TestRegistry r;
    ostringstream oss;
    std::unique_ptr<testinator::Outputter> op =
      make_unique<testinator::DefaultOutputter>(oss, testinator::OF_NONE);

    TestAbortInternal myTestA(r, "A");
    TestAbortInternal myTestB(r, "B");
    testinator::RunParams params;
    params.m_flags = testinator::RF_ALPHA_ORDER;
    testinator::Results rs = r.RunAllTests(params, op.get());

    static string expected = "ABORT (Hello world 42)";
    return !myTestB.m_runCalled
      && oss.str().find(expected) != string::npos;
  }